

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O0

int IDAGetNumLinResEvals(void *ida_mem,long *nrevalsLS)

{
  undefined8 *in_RSI;
  int retval;
  IDALsMem idals_mem;
  IDAMem IDA_mem;
  IDAMem *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  void *in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  local_4 = idaLs_AccessLMem(in_stack_ffffffffffffffd8,
                             (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                             in_stack_ffffffffffffffc8,(IDALsMem *)0x11c889);
  if (local_4 == 0) {
    *in_RSI = *(undefined8 *)((long)in_stack_ffffffffffffffd8 + 0xa8);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int IDAGetNumLinResEvals(void* ida_mem, long int* nrevalsLS)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  int retval;

  /* access IDALsMem structure; store output and return */
  retval = idaLs_AccessLMem(ida_mem, __func__, &IDA_mem, &idals_mem);
  if (retval != IDALS_SUCCESS) { return (retval); }
  *nrevalsLS = idals_mem->nreDQ;
  return (IDALS_SUCCESS);
}